

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayout.cpp
# Opt level: O3

void __thiscall QLayout::removeItem(QLayout *this,QLayoutItem *item)

{
  QLayoutItem *pQVar1;
  int iVar3;
  long lVar2;
  
  lVar2 = *(long *)this;
  iVar3 = 0;
  while( true ) {
    pQVar1 = (QLayoutItem *)(**(code **)(lVar2 + 0xa8))(this,iVar3);
    if (pQVar1 == (QLayoutItem *)0x0) break;
    if (pQVar1 == item) {
      (**(code **)(*(long *)this + 0xb0))(this,iVar3);
      (**(code **)(*(long *)this + 0x70))(this);
    }
    else {
      iVar3 = iVar3 + 1;
    }
    lVar2 = *(long *)this;
  }
  return;
}

Assistant:

void QLayout::removeItem(QLayoutItem *item)
{
    int i = 0;
    QLayoutItem *child;
    while ((child = itemAt(i))) {
        if (child == item) {
            takeAt(i);
            invalidate();
        } else {
            ++i;
        }
    }
}